

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::List(ConfigData *config)

{
  size_t count;
  bool bVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
  *pmVar4;
  undefined4 extraout_var_00;
  pointer ppVar5;
  undefined4 extraout_var_01;
  vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_> *pvVar6;
  undefined4 extraout_var_02;
  reference testCase;
  pointer pTVar7;
  string *psVar8;
  ostream *poVar9;
  domain_error *this;
  string local_2a0 [32];
  ostringstream local_280 [8];
  ostringstream oss;
  allocator<char> local_101;
  string local_100;
  pluralise local_e0;
  allocator<char> local_b1;
  string local_b0;
  pluralise local_90;
  size_t local_68;
  size_t matchedTests;
  const_iterator itEnd_1;
  const_iterator it_1;
  string local_40 [32];
  _Self local_20;
  const_iterator itEnd;
  const_iterator it;
  ConfigData *config_local;
  
  if ((config->listSpec & Reports) != None) {
    std::operator<<((ostream *)&std::cout,"Available reports:\n");
    pIVar3 = getRegistryHub();
    iVar2 = (*pIVar3->_vptr_IRegistryHub[2])();
    pmVar4 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
              *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))();
    itEnd = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
            ::begin(pmVar4);
    pIVar3 = getRegistryHub();
    iVar2 = (*pIVar3->_vptr_IRegistryHub[2])();
    pmVar4 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
              *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x18))();
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>_>
         ::end(pmVar4);
    while (bVar1 = std::operator!=(&itEnd,&local_20), bVar1) {
      poVar9 = std::operator<<((ostream *)&std::cout,"\t");
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
               ::operator->(&itEnd);
      poVar9 = std::operator<<(poVar9,(string *)ppVar5);
      poVar9 = std::operator<<(poVar9,"\n\t\t\'");
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
               ::operator->(&itEnd);
      (*ppVar5->second->_vptr_IReporterFactory[3])();
      poVar9 = std::operator<<(poVar9,local_40);
      std::operator<<(poVar9,"\'\n");
      std::__cxx11::string::~string(local_40);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IReporterFactory_*>_>
      ::operator++(&itEnd);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  if ((config->listSpec & Tests) != None) {
    bVar1 = std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::empty
                      (&config->filters);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,"All available test cases:\n");
    }
    else {
      std::operator<<((ostream *)&std::cout,"Matching test cases:\n");
    }
    pIVar3 = getRegistryHub();
    iVar2 = (*pIVar3->_vptr_IRegistryHub[3])();
    pvVar6 = (vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_> *)
             (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x10))();
    itEnd_1 = std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>::begin(pvVar6);
    pIVar3 = getRegistryHub();
    iVar2 = (*pIVar3->_vptr_IRegistryHub[3])();
    pvVar6 = (vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_> *)
             (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x10))();
    matchedTests = (size_t)std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>::
                           end(pvVar6);
    local_68 = 0;
    while (bVar1 = __gnu_cxx::operator!=
                             (&itEnd_1,(__normal_iterator<const_Catch::TestCaseInfo_*,_std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>_>
                                        *)&matchedTests), bVar1) {
      testCase = __gnu_cxx::
                 __normal_iterator<const_Catch::TestCaseInfo_*,_std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>_>
                 ::operator*(&itEnd_1);
      bVar1 = matchesFilters(&config->filters,testCase);
      if (bVar1) {
        local_68 = local_68 + 1;
        poVar9 = std::operator<<((ostream *)&std::cout,"\t");
        pTVar7 = __gnu_cxx::
                 __normal_iterator<const_Catch::TestCaseInfo_*,_std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>_>
                 ::operator->(&itEnd_1);
        psVar8 = TestCaseInfo::getName_abi_cxx11_(pTVar7);
        poVar9 = std::operator<<(poVar9,(string *)psVar8);
        std::operator<<(poVar9,"\n");
        if ((config->listSpec & TestNames) != TestNames) {
          poVar9 = std::operator<<((ostream *)&std::cout,"\t\t \'");
          pTVar7 = __gnu_cxx::
                   __normal_iterator<const_Catch::TestCaseInfo_*,_std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>_>
                   ::operator->(&itEnd_1);
          psVar8 = TestCaseInfo::getDescription_abi_cxx11_(pTVar7);
          poVar9 = std::operator<<(poVar9,(string *)psVar8);
          std::operator<<(poVar9,"\'\n");
        }
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCaseInfo_*,_std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>_>
      ::operator++(&itEnd_1);
    }
    bVar1 = std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::empty
                      (&config->filters);
    count = local_68;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"test case",&local_b1);
      pluralise::pluralise(&local_90,count,&local_b0);
      poVar9 = operator<<((ostream *)&std::cout,&local_90);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      pluralise::~pluralise(&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"matching test case",&local_101);
      pluralise::pluralise(&local_e0,count,&local_100);
      poVar9 = operator<<((ostream *)&std::cout,&local_e0);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      pluralise::~pluralise(&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
    }
  }
  if ((config->listSpec & All) != None) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_280);
  std::operator<<((ostream *)local_280,"Unknown list type");
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::domain_error::domain_error(this,local_2a0);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline void List( const ConfigData& config ) {

        if( config.listSpec & List::Reports ) {
            std::cout << "Available reports:\n";
            IReporterRegistry::FactoryMap::const_iterator it = getRegistryHub().getReporterRegistry().getFactories().begin();
            IReporterRegistry::FactoryMap::const_iterator itEnd = getRegistryHub().getReporterRegistry().getFactories().end();
            for(; it != itEnd; ++it ) {
                // !TBD: consider listAs()
                std::cout << "\t" << it->first << "\n\t\t'" << it->second->getDescription() << "'\n";
            }
            std::cout << std::endl;
        }

        if( config.listSpec & List::Tests ) {
            if( config.filters.empty() )
                std::cout << "All available test cases:\n";
            else
                std::cout << "Matching test cases:\n";
            std::vector<TestCaseInfo>::const_iterator it = getRegistryHub().getTestCaseRegistry().getAllTests().begin();
            std::vector<TestCaseInfo>::const_iterator itEnd = getRegistryHub().getTestCaseRegistry().getAllTests().end();
            std::size_t matchedTests = 0;
            for(; it != itEnd; ++it ) {
                if( matchesFilters( config.filters, *it ) ) {
                    matchedTests++;
                    // !TBD: consider listAs()
                    std::cout << "\t" << it->getName() << "\n";
                    if( ( config.listSpec & List::TestNames ) != List::TestNames )
                        std::cout << "\t\t '" << it->getDescription() << "'\n";
                }
            }
            if( config.filters.empty() )
                std::cout << pluralise( matchedTests, "test case" ) << std::endl;
            else
                std::cout << pluralise( matchedTests, "matching test case" ) << std::endl;
        }

        if( ( config.listSpec & List::All ) == 0 ) {
            std::ostringstream oss;
            oss << "Unknown list type";
            throw std::domain_error( oss.str() );
        }
    }